

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

bool __thiscall GameEngine::validate(GameEngine *this)

{
  bool bVar1;
  int32_t iVar2;
  element_type *peVar3;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *this_00;
  element_type *peVar4;
  element_type *this_01;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *this_02;
  __shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  element_type *this_04;
  size_type sVar5;
  ostream *this_05;
  shared_ptr<Population> local_a8;
  __shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_98;
  shared_ptr<Population> *population;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *__range2;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> newPopulations;
  shared_ptr<Player> *player;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> *__range1;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> newPlayers;
  GameEngine *this_local;
  
  newPlayers.super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::vector
            ((vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> *)&__range1
            );
  __end1 = std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::begin
                     (&this->players);
  player = (shared_ptr<Player> *)
           std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::end
                     (&this->players);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
                                *)&player);
    if (!bVar1) break;
    newPopulations.
    super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
                  ::operator*(&__end1);
    std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::vector
              ((vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *
               )&__range2);
    peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        newPopulations.
                        super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = Player::GetPlayerPopulations(peVar3);
    __end2 = std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
             ::begin(this_00);
    population = (shared_ptr<Population> *)
                 std::
                 vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                 ::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
                                  *)&population);
      if (!bVar1) break;
      local_98 = (__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 __gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
                 ::operator*(&__end2);
      peVar4 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_98);
      iVar2 = Population::GetAnimalAmount(peVar4);
      if (iVar2 < 1) {
        this_01 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                            ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             this);
        peVar4 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_98);
        iVar2 = Population::GetYPos(peVar4);
        this_02 = Map::operator[](this_01,(long)iVar2);
        peVar4 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_98);
        iVar2 = Population::GetXPos(peVar4);
        this_03 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](this_02,(long)iVar2);
        this_04 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(this_03);
        std::shared_ptr<Population>::shared_ptr(&local_a8,(nullptr_t)0x0);
        CellType::setCurrentPopulation(this_04,&local_a8);
        std::shared_ptr<Population>::~shared_ptr(&local_a8);
      }
      else {
        std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::
        push_back((vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                   *)&__range2,(value_type *)local_98);
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
      ::operator++(&__end2);
    }
    peVar3 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        newPopulations.
                        super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Player::SetPlayerPopulations
              (peVar3,(vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                       *)&__range2);
    bVar1 = std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
            ::empty((vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                     *)&__range2);
    if (!bVar1) {
      std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::push_back
                ((vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> *)
                 &__range1,
                 (value_type *)
                 newPopulations.
                 super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::~vector
              ((vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *
               )&__range2);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::operator=
            (&this->players,
             (vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> *)&__range1
            );
  sVar5 = std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::size
                    (&this->players);
  if ((sVar5 < 2) || (this->maxStep < this->currentStep)) {
    this_05 = std::operator<<((ostream *)&std::cout,"End game!");
    std::ostream::operator<<(this_05,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::~vector
            ((vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> *)&__range1
            );
  return this_local._7_1_;
}

Assistant:

bool GameEngine::validate() {
  std::vector<std::shared_ptr<Player> > newPlayers;
  for (const auto &player : players) {
    std::vector<std::shared_ptr<Population> > newPopulations;
    for (const auto &population : player->GetPlayerPopulations()) {
      if (population->GetAnimalAmount() > 0) {
        newPopulations.push_back(population);
      } else {
        (*map)[population->GetYPos()][population->GetXPos()]->setCurrentPopulation(nullptr);
      }
    }
    player->SetPlayerPopulations(newPopulations);

    if (!newPopulations.empty()) {
      newPlayers.push_back(player);
    }
  }
  players = newPlayers;

  if ((players.size() < 2) || (currentStep > maxStep)) {
    std::cout << "End game!" << std::endl;
    return false;
  }
  return true;
}